

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O1

void ImGui::TableUpdateLayout(ImGuiTable *table)

{
  float fVar1;
  float fVar2;
  float fVar3;
  ImVec2 IVar4;
  char cVar5;
  char cVar6;
  byte bVar7;
  uint uVar8;
  ImGuiWindow *pIVar9;
  float fVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  ImGuiContext *pIVar13;
  bool bVar14;
  bool bVar15;
  ImGuiID id;
  char *pcVar16;
  ulong uVar17;
  byte *pbVar18;
  bool bVar19;
  byte bVar20;
  ulong uVar21;
  int iVar22;
  char cVar23;
  uint uVar24;
  long lVar25;
  uint uVar26;
  ulong uVar27;
  ImGuiTableColumn *pIVar28;
  ImGuiTableColumn *pIVar29;
  uint uVar30;
  bool bVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 extraout_var [60];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar45 [16];
  float fVar40;
  float fVar41;
  undefined1 auVar42 [16];
  float fVar43;
  undefined4 uVar44;
  undefined1 auVar46 [64];
  undefined4 uVar47;
  undefined1 auVar48 [16];
  undefined1 auVar49 [64];
  undefined1 local_c8 [16];
  float local_a8;
  undefined1 local_68 [40];
  ImRect local_40;
  
  pIVar13 = GImGui;
  if (table->IsLayoutLocked != false) {
    __assert_fail("table->IsLayoutLocked == false",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_tables.cpp"
                  ,0x2ab,"void ImGui::TableUpdateLayout(ImGuiTable *)");
  }
  uVar26 = table->Flags & 0xe000;
  table->IsDefaultDisplayOrder = true;
  table->ColumnsEnabledCount = '\0';
  table->EnabledMaskByDisplayOrder = 0;
  table->EnabledMaskByIndex = 0;
  table->LeftMostEnabledColumn = -1;
  auVar45 = vmaxss_avx(SUB6416(ZEXT464(0x3f800000),0),ZEXT416((uint)(pIVar13->Style).FramePadding.x)
                      );
  table->MinColumnWidth = auVar45._0_4_;
  uVar30 = table->ColumnsCount;
  bVar15 = false;
  if ((int)uVar30 < 1) {
    uVar24 = 0xffffffff;
    bVar19 = true;
    local_c8 = ZEXT816(0) << 0x20;
    local_a8 = 0.0;
    fVar32 = 0.0;
    cVar23 = '\0';
  }
  else {
    cVar23 = '\0';
    uVar24 = 0xffffffff;
    uVar27 = 0;
    auVar45._12_4_ = 0;
    auVar45._0_12_ = local_68._4_12_;
    local_68._0_16_ = auVar45 << 0x20;
    bVar15 = false;
    bVar19 = false;
    local_a8 = 0.0;
    local_c8 = ZEXT816(0);
    do {
      pcVar16 = (table->DisplayOrderToIndex).Data + uVar27;
      if ((table->DisplayOrderToIndex).DataEnd <= pcVar16) goto LAB_00199fe7;
      cVar5 = *pcVar16;
      uVar30 = (uint)cVar5;
      if (uVar27 != uVar30) {
        table->IsDefaultDisplayOrder = false;
      }
      if ((cVar5 < '\0') ||
         (pIVar28 = (table->Columns).Data + cVar5, (table->Columns).DataEnd <= pIVar28))
      goto LAB_00199fd0;
      if (table->DeclColumnsCount <= cVar5) {
        TableSetupColumnFlags(table,pIVar28,0);
        pIVar28->NameOffset = -1;
        pIVar28->UserID = 0;
        pIVar28->InitStretchWeightOrWidth = -1.0;
      }
      uVar8 = table->Flags;
      if (((uVar8 & 4) == 0) || ((pIVar28->Flags & 0x40) != 0)) {
        pIVar28->IsEnabledNextFrame = true;
      }
      bVar14 = pIVar28->IsEnabledNextFrame;
      if (pIVar28->IsEnabled != bVar14) {
        pIVar28->IsEnabled = bVar14;
        table->IsSettingsDirty = true;
        if ((bVar14 == false) && (pIVar28->SortOrder != -1)) {
          table->IsSortSpecsDirty = true;
        }
      }
      if (((uVar8 >> 0x1a & 1) == 0) && ('\0' < pIVar28->SortOrder)) {
        table->IsSortSpecsDirty = true;
      }
      uVar8 = pIVar28->Flags;
      if ((&pIVar28->WidthRequest)[(ulong)((uVar8 & 8) == 0) * 2] < 0.0) {
        pIVar28->AutoFitQueue = '\a';
        pIVar28->CannotSkipItemsQueue = '\a';
      }
      if (pIVar28->IsEnabled == false) {
        pIVar28->IndexWithinEnabledSet = -1;
      }
      else {
        pIVar28->PrevEnabledColumn = (ImGuiTableColumnIdx)uVar24;
        pIVar28->NextEnabledColumn = -1;
        if (uVar24 == 0xffffffff) {
          table->LeftMostEnabledColumn = cVar5;
        }
        else {
          if (((int)uVar24 < 0) ||
             (pIVar29 = (table->Columns).Data + (int)uVar24, (table->Columns).DataEnd <= pIVar29))
          goto LAB_00199fd0;
          pIVar29->NextEnabledColumn = cVar5;
        }
        cVar5 = table->ColumnsEnabledCount;
        table->ColumnsEnabledCount = cVar5 + '\x01';
        pIVar28->IndexWithinEnabledSet = cVar5;
        cVar6 = pIVar28->DisplayOrder;
        auVar45 = vpunpcklqdq_avx(ZEXT416((uint)(int)cVar6),ZEXT416(uVar30));
        auVar39._8_8_ = 1;
        auVar39._0_8_ = 1;
        auVar45 = vpsllvq_avx2(auVar39,auVar45);
        auVar37._0_8_ = table->EnabledMaskByDisplayOrder;
        auVar37._8_8_ = table->EnabledMaskByIndex;
        auVar45 = vpor_avx(auVar45,auVar37);
        table->EnabledMaskByDisplayOrder = auVar45._0_8_;
        table->EnabledMaskByIndex = auVar45._8_8_;
        if (cVar6 < cVar5) {
          __assert_fail("column->IndexWithinEnabledSet <= column->DisplayOrder",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_tables.cpp"
                        ,0x2f3,"void ImGui::TableUpdateLayout(ImGuiTable *)");
        }
        if (pIVar28->IsPreserveWidthAuto == false) {
          fVar32 = TableGetColumnWidthAuto(table,pIVar28);
          pIVar28->WidthAuto = fVar32;
        }
        if ((uVar8 & 0x10) == 0) {
          bVar19 = true;
        }
        if ((((uVar8 & 8) != 0) && ((uVar8 & 0x10) != 0)) &&
           (0.0 < pIVar28->InitStretchWeightOrWidth)) {
          pIVar28->WidthAuto = pIVar28->InitStretchWeightOrWidth;
        }
        if (pIVar28->AutoFitQueue != '\0') {
          bVar15 = true;
        }
        fVar32 = pIVar28->WidthAuto;
        uVar24 = uVar30;
        if ((uVar8 & 4) == 0) {
          auVar45 = vcmpss_avx(ZEXT416((uint)fVar32),local_c8,2);
          local_c8 = vblendvps_avx(ZEXT416((uint)fVar32),local_c8,auVar45);
          cVar23 = cVar23 + '\x01';
        }
        else {
          local_a8 = local_a8 + fVar32;
          local_68._0_4_ = local_68._0_4_ + 1;
        }
      }
      uVar27 = uVar27 + 1;
      uVar30 = table->ColumnsCount;
    } while ((long)uVar27 < (long)(int)uVar30);
    fVar32 = (float)(int)local_68._0_4_;
    bVar19 = !bVar19;
  }
  uVar8 = table->Flags;
  if ((((uVar8 & 8) != 0) && ((uVar8 >> 0x1b & 1) == 0)) && (table->SortSpecsCount == '\0')) {
    table->IsSortSpecsDirty = true;
  }
  table->RightMostEnabledColumn = (ImGuiTableColumnIdx)uVar24;
  if ((table->LeftMostEnabledColumn < '\0') || ((uVar24 & 0x80) != 0)) {
    __assert_fail("table->LeftMostEnabledColumn >= 0 && table->RightMostEnabledColumn >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_tables.cpp"
                  ,0x311,"void ImGui::TableUpdateLayout(ImGuiTable *)");
  }
  if (bVar15) {
    if (table->OuterWindow != table->InnerWindow) {
      table->InnerWindow->SkipItems = false;
    }
    table->IsSettingsDirty = true;
  }
  table->LeftMostStretchedColumn = -1;
  table->RightMostStretchedColumn = -1;
  if ((int)uVar30 < 1) {
    fVar33 = 0.0;
    fVar40 = 0.0;
  }
  else {
    uVar27 = table->EnabledMaskByIndex;
    lVar25 = 0x62;
    uVar21 = 0;
    fVar40 = 0.0;
    fVar33 = 0.0;
    do {
      bVar20 = (byte)uVar21;
      if ((uVar27 >> (uVar21 & 0x3f) & 1) != 0) {
        pIVar28 = (table->Columns).Data;
        pIVar29 = (ImGuiTableColumn *)((long)pIVar28 + lVar25 + -0x62);
        if ((table->Columns).DataEnd <= pIVar29) goto LAB_00199fd0;
        uVar24 = pIVar29->Flags;
        if ((uVar24 & 8) == 0) {
          if ((((uVar24 & 0x10) != 0) || (*(char *)((long)&pIVar28->Flags + lVar25) != '\0')) ||
             (*(float *)((long)pIVar28 + lVar25 + -0x4a) < 0.0)) {
            fVar43 = *(float *)((long)pIVar28 + lVar25 + -0x46);
            bVar15 = fVar43 <= 0.0;
            if (fVar43 <= 0.0) {
              fVar43 = 1.0;
            }
            if (bVar15 && uVar26 == 0x6000) {
              fVar43 = (*(float *)((long)pIVar28 + lVar25 + -0x4e) / local_a8) * fVar32;
            }
            *(float *)((long)pIVar28 + lVar25 + -0x4a) = fVar43;
          }
          fVar33 = fVar33 + *(float *)((long)pIVar28 + lVar25 + -0x4a);
          cVar5 = table->LeftMostStretchedColumn;
          if ((long)cVar5 == -1) {
LAB_001995ba:
            table->LeftMostStretchedColumn = bVar20;
          }
          else {
            if ((cVar5 < '\0') || ((table->Columns).DataEnd <= pIVar28 + cVar5)) goto LAB_00199fd0;
            if (*(char *)((long)pIVar28 + lVar25 + -0x10) < pIVar28[cVar5].DisplayOrder)
            goto LAB_001995ba;
          }
          cVar5 = table->RightMostStretchedColumn;
          if ((long)cVar5 != -1) {
            if ((cVar5 < '\0') || ((table->Columns).DataEnd <= pIVar28 + cVar5)) goto LAB_00199fd0;
            if (*(char *)((long)pIVar28 + lVar25 + -0x10) <= pIVar28[cVar5].DisplayOrder)
            goto LAB_00199690;
          }
          table->RightMostStretchedColumn = bVar20;
        }
        else {
          uVar44 = *(undefined4 *)((long)pIVar28 + lVar25 + -0x4e);
          if (uVar26 == 0x4000) {
            uVar47 = local_c8._0_4_;
            if (*(char *)((long)&pIVar28->Flags + lVar25) == '\0') {
              uVar47 = uVar44;
            }
            uVar44 = local_c8._0_4_;
            if ((uVar24 & 0x10) == 0) {
              uVar44 = uVar47;
            }
          }
          bVar7 = *(byte *)((long)&pIVar28->Flags + lVar25);
          if ((bVar7 != 0) ||
             (((uVar24 & 0x10) != 0 &&
              ((table->RequestOutputMaskByIndex & 1L << (bVar20 & 0x3f)) != 0)))) {
            *(undefined4 *)((long)pIVar28 + lVar25 + -0x52) = uVar44;
          }
          if (((1 < bVar7) && (table->IsInitializing == true)) &&
             (*(char *)((long)pIVar28 + lVar25 + -2) == '\0')) {
            auVar37 = ZEXT416(*(uint *)((long)pIVar28 + lVar25 + -0x52));
            auVar39 = ZEXT416((uint)(table->MinColumnWidth * 4.0));
            auVar45 = vcmpss_avx(auVar39,auVar37,2);
            auVar45 = vblendvps_avx(auVar39,auVar37,auVar45);
            *(int *)((long)pIVar28 + lVar25 + -0x52) = auVar45._0_4_;
          }
          fVar40 = fVar40 + *(float *)((long)pIVar28 + lVar25 + -0x52);
        }
LAB_00199690:
        *(undefined1 *)((long)pIVar28 + lVar25 + -2) = 0;
        fVar40 = table->CellPaddingX + table->CellPaddingX + fVar40;
      }
      uVar21 = uVar21 + 1;
      lVar25 = lVar25 + 0x68;
    } while (uVar30 != uVar21);
  }
  table->ColumnsEnabledFixedCount = cVar23;
  fVar32 = (table->WorkRect).Min.x;
  fVar43 = table->OuterPaddingX + table->OuterPaddingX +
           (table->CellSpacingX1 + table->CellSpacingX2) * (float)(table->ColumnsEnabledCount + -1);
  if ((((uVar8 >> 0x18 & 1) == 0) || (table->InnerWidth != 0.0)) || (NAN(table->InnerWidth))) {
    fVar41 = (table->WorkRect).Max.x - fVar32;
  }
  else {
    fVar41 = (table->InnerClipRect).Max.x - (table->InnerClipRect).Min.x;
  }
  fVar1 = (table->WorkRect).Min.y;
  fVar40 = (fVar41 - fVar43) - fVar40;
  table->ColumnsGivenWidth =
       (table->CellPaddingX + table->CellPaddingX) * (float)(int)table->ColumnsEnabledCount + fVar43
  ;
  fVar43 = fVar40;
  if (0 < (int)uVar30) {
    uVar27 = table->EnabledMaskByIndex;
    lVar25 = 0x55;
    uVar21 = 0;
    do {
      if ((uVar27 >> (uVar21 & 0x3f) & 1) != 0) {
        pIVar28 = (table->Columns).Data;
        pIVar29 = (ImGuiTableColumn *)((long)pIVar28 + lVar25 + -0x55);
        if ((table->Columns).DataEnd <= pIVar29) goto LAB_00199fd0;
        uVar26 = pIVar29->Flags;
        if ((uVar26 & 4) != 0) {
          auVar37 = ZEXT416((uint)(fVar40 * (*(float *)((long)pIVar28 + lVar25 + -0x3d) / fVar33)));
          auVar45 = vcmpss_avx(ZEXT416((uint)table->MinColumnWidth),auVar37,2);
          auVar45 = vblendvps_avx(ZEXT416((uint)table->MinColumnWidth),auVar37,auVar45);
          auVar45 = vcvtdq2ps_avx(ZEXT416((uint)(int)(auVar45._0_4_ + 0.01)));
          *(float *)((long)pIVar28 + lVar25 + -0x45) = auVar45._0_4_;
          fVar43 = fVar43 - auVar45._0_4_;
        }
        if ((*(char *)((long)&pIVar28->Flags + lVar25) == -1) &&
           (table->LeftMostStretchedColumn != -1)) {
          pIVar29->Flags = uVar26 | 0x40000000;
        }
        auVar37 = ZEXT416(*(uint *)((long)pIVar28 + lVar25 + -0x45));
        auVar45 = vcmpss_avx(ZEXT416((uint)table->MinColumnWidth),auVar37,2);
        auVar45 = vblendvps_avx(ZEXT416((uint)table->MinColumnWidth),auVar37,auVar45);
        auVar42._0_4_ = (int)auVar45._0_4_;
        auVar42._4_4_ = (int)auVar45._4_4_;
        auVar42._8_4_ = (int)auVar45._8_4_;
        auVar42._12_4_ = (int)auVar45._12_4_;
        auVar45 = vcvtdq2ps_avx(auVar42);
        *(float *)((long)pIVar28 + lVar25 + -0x51) = auVar45._0_4_;
        table->ColumnsGivenWidth = auVar45._0_4_ + table->ColumnsGivenWidth;
      }
      uVar21 = uVar21 + 1;
      lVar25 = lVar25 + 0x68;
    } while (uVar30 != uVar21);
  }
  if ((((uVar8 >> 0x13 & 1) == 0) && (1.0 <= fVar43)) &&
     ((1.0 <= fVar43 && ((0 < (int)uVar30 && (0.0 < fVar33)))))) {
    uVar27 = table->EnabledMaskByDisplayOrder;
    uVar21 = (ulong)uVar30;
    do {
      uVar17 = uVar21 - 1;
      if ((uVar27 >> (uVar17 & 0x3f) & 1) != 0) {
        pcVar16 = (table->DisplayOrderToIndex).Data + uVar17;
        if ((table->DisplayOrderToIndex).DataEnd <= pcVar16) goto LAB_00199fe7;
        lVar25 = (long)*pcVar16;
        if ((lVar25 < 0) ||
           (pIVar28 = (table->Columns).Data + lVar25, (table->Columns).DataEnd <= pIVar28))
        goto LAB_00199fd0;
        if ((pIVar28->Flags & 4) != 0) {
          pIVar28->WidthRequest = pIVar28->WidthRequest + 1.0;
          pIVar28->WidthGiven = pIVar28->WidthGiven + 1.0;
          fVar43 = fVar43 + -1.0;
        }
      }
    } while (((0.0 < fVar33) && (1.0 <= fVar43)) &&
            (bVar15 = 1 < (long)uVar21, uVar21 = uVar17, bVar15));
  }
  table->HoveredColumnBody = -1;
  table->HoveredColumnBorder = -1;
  local_40.Max.x = (table->OuterRect).Max.x;
  local_40.Min = (table->OuterRect).Min;
  auVar38._8_8_ = 0;
  auVar38._0_4_ = local_40.Min.x;
  auVar38._4_4_ = local_40.Min.y;
  auVar45 = vmovshdup_avx(auVar38);
  auVar37 = ZEXT416((uint)(auVar45._0_4_ + table->LastOuterHeight));
  auVar39 = ZEXT416((uint)(table->OuterRect).Max.y);
  auVar45 = vcmpss_avx(auVar37,auVar39,2);
  auVar45 = vblendvps_avx(auVar37,auVar39,auVar45);
  local_40.Max.y = auVar45._0_4_;
  bVar14 = ItemHoverable(&local_40,0);
  bVar15 = '\0' < table->FreezeColumnsCount;
  fVar33 = fVar32;
  if ('\0' < table->FreezeColumnsCount) {
    fVar33 = (table->OuterRect).Min.x;
  }
  auVar46 = ZEXT464((uint)(table->InnerClipRect).Min.x);
  fVar40 = (table->InnerClipRect).Min.y;
  auVar48._8_8_ = 0;
  auVar48._0_4_ = (table->InnerClipRect).Max.x;
  auVar48._4_4_ = (table->InnerClipRect).Max.y;
  table->VisibleMaskByIndex = 0;
  table->RequestOutputMaskByIndex = 0;
  uVar27 = (ulong)(uint)table->ColumnsCount;
  if (table->ColumnsCount < 1) {
LAB_00199e01:
    if ((-1 < (long)table->RightMostEnabledColumn) &&
       (pIVar28 = (table->Columns).Data + table->RightMostEnabledColumn,
       pIVar28 < (table->Columns).DataEnd)) {
      auVar37 = ZEXT416((uint)(table->WorkRect).Min.x);
      auVar39 = ZEXT416((uint)(pIVar28->ClipRect).Max.x);
      auVar45 = vcmpss_avx(auVar39,auVar37,2);
      auVar45 = vblendvps_avx(auVar39,auVar37,auVar45);
      fVar32 = auVar45._0_4_;
      if ((bVar14) && ((table->HoveredColumnBody == -1 && (fVar32 <= (pIVar13->IO).MousePos.x)))) {
        table->HoveredColumnBody = (ImGuiTableColumnIdx)uVar27;
      }
      if ((bVar19) && ((table->Flags & 1U) != 0)) {
        table->Flags = table->Flags & 0xfffffffe;
      }
      if (table->RightMostStretchedColumn != -1) {
        pbVar18 = (byte *)((long)&table->Flags + 2);
        *pbVar18 = *pbVar18 & 0xfe;
      }
      if ((table->Flags & 0x10000) != 0) {
        (table->WorkRect).Max.x = fVar32;
        (table->OuterRect).Max.x = fVar32;
        auVar45 = vminss_avx(ZEXT416((uint)(table->InnerClipRect).Max.x),auVar45);
        (table->InnerClipRect).Max.x = auVar45._0_4_;
      }
      pIVar9 = table->InnerWindow;
      IVar4 = (table->WorkRect).Max;
      (pIVar9->ParentWorkRect).Min = (table->WorkRect).Min;
      (pIVar9->ParentWorkRect).Max = IVar4;
      fVar32 = (table->InnerClipRect).Max.x;
      table->BorderX1 = (table->InnerClipRect).Min.x;
      table->BorderX2 = fVar32;
      TableSetupDrawChannels(table);
      if ((table->Flags & 1) != 0) {
        TableUpdateBorders(table);
      }
      table->LastFirstRowHeight = 0.0;
      table->IsLayoutLocked = true;
      table->IsUsingHeaders = false;
      if ((table->IsContextPopupOpen == true) &&
         (table->InstanceCurrent == table->InstanceInteracted)) {
        id = ImHashStr("##ContextMenu",0,table->ID);
        bVar15 = BeginPopupEx(id,0x141);
        if (bVar15) {
          TableDrawContextMenu(table);
          EndPopup();
        }
        else {
          table->IsContextPopupOpen = false;
        }
      }
      if ((table->IsSortSpecsDirty == true) && ((table->Flags & 8) != 0)) {
        TableSortSpecsBuild(table);
      }
      pIVar9 = table->InnerWindow;
      if ((table->Flags & 0x100000) == 0) {
        ImDrawList::PushClipRect
                  (pIVar9->DrawList,(pIVar9->ClipRect).Min,(pIVar9->ClipRect).Max,false);
      }
      else {
        ImDrawListSplitter::SetCurrentChannel(&table->DrawSplitter,pIVar9->DrawList,2);
      }
      return;
    }
LAB_00199fd0:
    pcVar16 = "T &ImSpan<ImGuiTableColumn>::operator[](int) [T = ImGuiTableColumn]";
  }
  else {
    auVar49 = ZEXT464((uint)((fVar33 + table->OuterPaddingX) - table->CellSpacingX1));
    uVar21 = 0;
    iVar22 = 0;
    while (pbVar18 = (byte *)((table->DisplayOrderToIndex).Data + uVar21),
          pbVar18 < (table->DisplayOrderToIndex).DataEnd) {
      bVar20 = *pbVar18;
      if (((long)(char)bVar20 < 0) ||
         (pIVar28 = (table->Columns).Data + (char)bVar20, (table->Columns).DataEnd <= pIVar28))
      goto LAB_00199fd0;
      bVar31 = true;
      if (table->FreezeRowsCount < '\x01') {
        bVar31 = (char)bVar20 < table->FreezeColumnsCount;
      }
      pIVar28->NavLayerCurrent = bVar31;
      if ((bVar15) && (iVar22 == table->FreezeColumnsCount)) {
        auVar49 = ZEXT464((uint)(auVar49._0_4_ + (fVar32 - (table->OuterRect).Min.x)));
        bVar15 = false;
      }
      pbVar18 = (byte *)((long)&pIVar28->Flags + 2);
      *pbVar18 = *pbVar18 & 0xf;
      auVar45 = auVar46._0_16_;
      fVar33 = auVar49._0_4_;
      if ((table->EnabledMaskByDisplayOrder >> (uVar21 & 0x3f) & 1) == 0) {
        (pIVar28->ClipRect).Max.x = fVar33;
        (pIVar28->ClipRect).Min.x = fVar33;
        pIVar28->WorkMinX = fVar33;
        pIVar28->MaxX = fVar33;
        pIVar28->MinX = fVar33;
        pIVar28->WidthGiven = 0.0;
        (pIVar28->ClipRect).Min.y = fVar1;
        (pIVar28->ClipRect).Max.y = 3.4028235e+38;
        auVar39 = vinsertps_avx(auVar49._0_16_,ZEXT416((uint)fVar1),0x10);
        auVar12._4_4_ = fVar40;
        auVar12._0_4_ = fVar40;
        auVar12._8_4_ = fVar40;
        auVar12._12_4_ = fVar40;
        auVar45 = vblendps_avx(auVar45,auVar12,0xe);
        auVar37 = vcmpps_avx(auVar39,auVar45,1);
        auVar39 = vminps_avx(auVar48,auVar39);
        auVar37 = vblendvps_avx(auVar39,auVar45,auVar37);
        IVar4 = (ImVec2)vmovlps_avx(auVar37);
        (pIVar28->ClipRect).Min = IVar4;
        auVar36._8_8_ = 0;
        auVar36._0_4_ = (pIVar28->ClipRect).Max.x;
        auVar36._4_4_ = (pIVar28->ClipRect).Max.y;
        auVar37 = vcmpps_avx(auVar36,auVar45,1);
        auVar39 = vminps_avx(auVar48,auVar36);
        auVar45 = vblendvps_avx(auVar39,auVar45,auVar37);
        IVar4 = (ImVec2)vmovlps_avx(auVar45);
        (pIVar28->ClipRect).Max = IVar4;
        pIVar28->IsVisibleX = false;
        pIVar28->IsVisibleY = false;
        pIVar28->IsRequestOutput = false;
        pIVar28->IsSkipItems = true;
        pIVar28->ItemWidth = 1.0;
      }
      else {
        if (((bVar14) && (fVar43 = (pIVar13->IO).MousePos.x, (pIVar28->ClipRect).Min.x <= fVar43))
           && (fVar43 < (pIVar28->ClipRect).Max.x)) {
          table->HoveredColumnBody = bVar20;
        }
        pIVar28->MinX = fVar33;
        auVar46._0_4_ = TableGetMaxColumnWidth(table,(int)(char)bVar20);
        auVar46._4_60_ = extraout_var;
        fVar43 = pIVar28->MinX;
        auVar39 = vminss_avx(ZEXT416((uint)pIVar28->WidthGiven),auVar46._0_16_);
        pIVar28->WidthGiven = auVar39._0_4_;
        auVar42 = vminss_avx(ZEXT416((uint)pIVar28->WidthRequest),
                             ZEXT416((uint)table->MinColumnWidth));
        auVar37 = vcmpss_avx(auVar42,auVar39,2);
        auVar37 = vblendvps_avx(auVar42,auVar39,auVar37);
        fVar34 = auVar37._0_4_;
        pIVar28->WidthGiven = fVar34;
        fVar41 = table->CellPaddingX;
        fVar2 = table->CellSpacingX1;
        fVar3 = table->CellSpacingX2;
        fVar10 = fVar41 + fVar41 + fVar3 + fVar2 + fVar33 + fVar34;
        pIVar28->MaxX = fVar10;
        pIVar28->WorkMinX = fVar2 + fVar41 + fVar43;
        pIVar28->WorkMaxX = (fVar10 - fVar41) - fVar3;
        auVar37 = vcvtdq2ps_avx(ZEXT416((uint)(int)(fVar34 * 0.65)));
        pIVar28->ItemWidth = auVar37._0_4_;
        (pIVar28->ClipRect).Min.x = fVar43;
        (pIVar28->ClipRect).Min.y = fVar1;
        (pIVar28->ClipRect).Max.x = fVar10;
        auVar42 = vinsertps_avx(ZEXT416((uint)fVar43),ZEXT416((uint)fVar1),0x10);
        auVar11._4_4_ = fVar40;
        auVar11._0_4_ = fVar40;
        auVar11._8_4_ = fVar40;
        auVar11._12_4_ = fVar40;
        auVar37 = vblendps_avx(auVar45,auVar11,0xe);
        auVar39 = vcmpps_avx(auVar42,auVar37,1);
        auVar42 = vminps_avx(auVar48,auVar42);
        auVar39 = vblendvps_avx(auVar42,auVar37,auVar39);
        (pIVar28->ClipRect).Max.y = 3.4028235e+38;
        IVar4 = (ImVec2)vmovlps_avx(auVar39);
        (pIVar28->ClipRect).Min = IVar4;
        auVar35._8_8_ = 0;
        auVar35._0_4_ = (pIVar28->ClipRect).Max.x;
        auVar35._4_4_ = (pIVar28->ClipRect).Max.y;
        auVar39 = vcmpps_avx(auVar35,auVar37,1);
        auVar42 = vminps_avx(auVar48,auVar35);
        auVar37 = vblendvps_avx(auVar42,auVar37,auVar39);
        IVar4 = (ImVec2)vmovlps_avx(auVar37);
        (pIVar28->ClipRect).Max = IVar4;
        fVar43 = (pIVar28->ClipRect).Max.x;
        fVar41 = (pIVar28->ClipRect).Min.x;
        pIVar28->IsVisibleX = fVar41 < fVar43;
        pIVar28->IsVisibleY = true;
        if (fVar43 <= fVar41) {
          if (pIVar28->AutoFitQueue != '\0') goto LAB_00199ce8;
          bVar31 = pIVar28->CannotSkipItemsQueue != '\0';
          pIVar28->IsRequestOutput = bVar31;
          if (bVar31) goto LAB_00199cee;
        }
        else {
          table->VisibleMaskByIndex = table->VisibleMaskByIndex | 1L << (bVar20 & 0x3f);
LAB_00199ce8:
          pIVar28->IsRequestOutput = true;
LAB_00199cee:
          table->RequestOutputMaskByIndex = table->RequestOutputMaskByIndex | 1L << (bVar20 & 0x3f);
        }
        bVar31 = true;
        if (pIVar28->IsEnabled == true) {
          bVar31 = table->HostSkipItems;
        }
        pIVar28->IsSkipItems = bVar31;
        if (bVar31 == true && fVar41 < fVar43) {
          __assert_fail("!is_visible",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_tables.cpp"
                        ,0x3e1,"void ImGui::TableUpdateLayout(ImGuiTable *)");
        }
        uVar30 = (uint)(fVar41 < fVar43) << 0x15 | pIVar28->Flags;
        pIVar28->Flags = uVar30 | 0x100000;
        if (pIVar28->SortOrder != -1) {
          pIVar28->Flags = uVar30 | 0x500000;
        }
        if (table->HoveredColumnBody == bVar20) {
          pbVar18 = (byte *)((long)&pIVar28->Flags + 2);
          *pbVar18 = *pbVar18 | 0x80;
        }
        fVar43 = pIVar28->WorkMinX;
        pIVar28->ContentMaxXFrozen = fVar43;
        pIVar28->ContentMaxXUnfrozen = fVar43;
        pIVar28->ContentMaxXHeadersUsed = fVar43;
        pIVar28->ContentMaxXHeadersIdeal = fVar43;
        if (table->HostSkipItems == false) {
          pIVar28->AutoFitQueue = pIVar28->AutoFitQueue >> 1;
          pIVar28->CannotSkipItemsQueue = pIVar28->CannotSkipItemsQueue >> 1;
        }
        if (iVar22 < table->FreezeColumnsCount) {
          auVar37 = ZEXT416((uint)(pIVar28->MaxX + 1.0));
          auVar39 = vminss_avx(auVar48,auVar37);
          auVar37 = vcmpss_avx(auVar37,auVar45,1);
          auVar45 = vblendvps_avx(auVar39,auVar45,auVar37);
        }
        auVar46 = ZEXT1664(auVar45);
        auVar49 = ZEXT464((uint)(fVar33 + table->CellPaddingX + table->CellPaddingX +
                                          pIVar28->WidthGiven + table->CellSpacingX1 +
                                          table->CellSpacingX2));
        iVar22 = iVar22 + 1;
      }
      uVar21 = uVar21 + 1;
      uVar27 = (ulong)table->ColumnsCount;
      if ((long)uVar27 <= (long)uVar21) goto LAB_00199e01;
    }
LAB_00199fe7:
    pcVar16 = "T &ImSpan<signed char>::operator[](int) [T = signed char]";
  }
  __assert_fail("p >= Data && p < DataEnd",
                "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_internal.h"
                ,0x216,pcVar16);
}

Assistant:

void ImGui::TableUpdateLayout(ImGuiTable* table)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(table->IsLayoutLocked == false);

    const ImGuiTableFlags table_sizing_policy = (table->Flags & ImGuiTableFlags_SizingMask_);
    table->IsDefaultDisplayOrder = true;
    table->ColumnsEnabledCount = 0;
    table->EnabledMaskByIndex = 0x00;
    table->EnabledMaskByDisplayOrder = 0x00;
    table->LeftMostEnabledColumn = -1;
    table->MinColumnWidth = ImMax(1.0f, g.Style.FramePadding.x * 1.0f); // g.Style.ColumnsMinSpacing; // FIXME-TABLE

    // [Part 1] Apply/lock Enabled and Order states. Calculate auto/ideal width for columns. Count fixed/stretch columns.
    // Process columns in their visible orders as we are building the Prev/Next indices.
    int count_fixed = 0;                // Number of columns that have fixed sizing policies
    int count_stretch = 0;              // Number of columns that have stretch sizing policies
    int prev_visible_column_idx = -1;
    bool has_auto_fit_request = false;
    bool has_resizable = false;
    float stretch_sum_width_auto = 0.0f;
    float fixed_max_width_auto = 0.0f;
    for (int order_n = 0; order_n < table->ColumnsCount; order_n++)
    {
        const int column_n = table->DisplayOrderToIndex[order_n];
        if (column_n != order_n)
            table->IsDefaultDisplayOrder = false;
        ImGuiTableColumn* column = &table->Columns[column_n];

        // Clear column setup if not submitted by user. Currently we make it mandatory to call TableSetupColumn() every frame.
        // It would easily work without but we're not ready to guarantee it since e.g. names need resubmission anyway.
        // We take a slight shortcut but in theory we could be calling TableSetupColumn() here with dummy values, it should yield the same effect.
        if (table->DeclColumnsCount <= column_n)
        {
            TableSetupColumnFlags(table, column, ImGuiTableColumnFlags_None);
            column->NameOffset = -1;
            column->UserID = 0;
            column->InitStretchWeightOrWidth = -1.0f;
        }

        // Update Enabled state, mark settings/sortspecs dirty
        if (!(table->Flags & ImGuiTableFlags_Hideable) || (column->Flags & ImGuiTableColumnFlags_NoHide))
            column->IsEnabledNextFrame = true;
        if (column->IsEnabled != column->IsEnabledNextFrame)
        {
            column->IsEnabled = column->IsEnabledNextFrame;
            table->IsSettingsDirty = true;
            if (!column->IsEnabled && column->SortOrder != -1)
                table->IsSortSpecsDirty = true;
        }
        if (column->SortOrder > 0 && !(table->Flags & ImGuiTableFlags_SortMulti))
            table->IsSortSpecsDirty = true;

        // Auto-fit unsized columns
        const bool start_auto_fit = (column->Flags & ImGuiTableColumnFlags_WidthFixed) ? (column->WidthRequest < 0.0f) : (column->StretchWeight < 0.0f);
        if (start_auto_fit)
            column->AutoFitQueue = column->CannotSkipItemsQueue = (1 << 3) - 1; // Fit for three frames

        if (!column->IsEnabled)
        {
            column->IndexWithinEnabledSet = -1;
            continue;
        }

        // Mark as enabled and link to previous/next enabled column
        column->PrevEnabledColumn = (ImGuiTableColumnIdx)prev_visible_column_idx;
        column->NextEnabledColumn = -1;
        if (prev_visible_column_idx != -1)
            table->Columns[prev_visible_column_idx].NextEnabledColumn = (ImGuiTableColumnIdx)column_n;
        else
            table->LeftMostEnabledColumn = (ImGuiTableColumnIdx)column_n;
        column->IndexWithinEnabledSet = table->ColumnsEnabledCount++;
        table->EnabledMaskByIndex |= (ImU64)1 << column_n;
        table->EnabledMaskByDisplayOrder |= (ImU64)1 << column->DisplayOrder;
        prev_visible_column_idx = column_n;
        IM_ASSERT(column->IndexWithinEnabledSet <= column->DisplayOrder);

        // Calculate ideal/auto column width (that's the width required for all contents to be visible without clipping)
        // Combine width from regular rows + width from headers unless requested not to.
        if (!column->IsPreserveWidthAuto)
            column->WidthAuto = TableGetColumnWidthAuto(table, column);

        // Non-resizable columns keep their requested width (apply user value regardless of IsPreserveWidthAuto)
        const bool column_is_resizable = (column->Flags & ImGuiTableColumnFlags_NoResize) == 0;
        if (column_is_resizable)
            has_resizable = true;
        if ((column->Flags & ImGuiTableColumnFlags_WidthFixed) && column->InitStretchWeightOrWidth > 0.0f && !column_is_resizable)
            column->WidthAuto = column->InitStretchWeightOrWidth;

        if (column->AutoFitQueue != 0x00)
            has_auto_fit_request = true;
        if (column->Flags & ImGuiTableColumnFlags_WidthStretch)
        {
            stretch_sum_width_auto += column->WidthAuto;
            count_stretch++;
        }
        else
        {
            fixed_max_width_auto = ImMax(fixed_max_width_auto, column->WidthAuto);
            count_fixed++;
        }
    }
    if ((table->Flags & ImGuiTableFlags_Sortable) && table->SortSpecsCount == 0 && !(table->Flags & ImGuiTableFlags_SortTristate))
        table->IsSortSpecsDirty = true;
    table->RightMostEnabledColumn = (ImGuiTableColumnIdx)prev_visible_column_idx;
    IM_ASSERT(table->LeftMostEnabledColumn >= 0 && table->RightMostEnabledColumn >= 0);

    // [Part 2] Disable child window clipping while fitting columns. This is not strictly necessary but makes it possible
    // to avoid the column fitting having to wait until the first visible frame of the child container (may or not be a good thing).
    // FIXME-TABLE: for always auto-resizing columns may not want to do that all the time.
    if (has_auto_fit_request && table->OuterWindow != table->InnerWindow)
        table->InnerWindow->SkipItems = false;
    if (has_auto_fit_request)
        table->IsSettingsDirty = true;

    // [Part 3] Fix column flags and record a few extra information.
    float sum_width_requests = 0.0f;        // Sum of all width for fixed and auto-resize columns, excluding width contributed by Stretch columns but including spacing/padding.
    float stretch_sum_weights = 0.0f;       // Sum of all weights for stretch columns.
    table->LeftMostStretchedColumn = table->RightMostStretchedColumn = -1;
    for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
    {
        if (!(table->EnabledMaskByIndex & ((ImU64)1 << column_n)))
            continue;
        ImGuiTableColumn* column = &table->Columns[column_n];

        const bool column_is_resizable = (column->Flags & ImGuiTableColumnFlags_NoResize) == 0;
        if (column->Flags & ImGuiTableColumnFlags_WidthFixed)
        {
            // Apply same widths policy
            float width_auto = column->WidthAuto;
            if (table_sizing_policy == ImGuiTableFlags_SizingFixedSame && (column->AutoFitQueue != 0x00 || !column_is_resizable))
                width_auto = fixed_max_width_auto; 

            // Apply automatic width
            // Latch initial size for fixed columns and update it constantly for auto-resizing column (unless clipped!)
            if (column->AutoFitQueue != 0x00)
                column->WidthRequest = width_auto;
            else if ((column->Flags & ImGuiTableColumnFlags_WidthFixed) && !column_is_resizable && (table->RequestOutputMaskByIndex & ((ImU64)1 << column_n)))
                column->WidthRequest = width_auto;

            // FIXME-TABLE: Increase minimum size during init frame to avoid biasing auto-fitting widgets
            // (e.g. TextWrapped) too much. Otherwise what tends to happen is that TextWrapped would output a very
            // large height (= first frame scrollbar display very off + clipper would skip lots of items).
            // This is merely making the side-effect less extreme, but doesn't properly fixes it.
            // FIXME: Move this to ->WidthGiven to avoid temporary lossyless?
            // FIXME: This break IsPreserveWidthAuto from not flickering if the stored WidthAuto was smaller.
            if (column->AutoFitQueue > 0x01 && table->IsInitializing && !column->IsPreserveWidthAuto)
                column->WidthRequest = ImMax(column->WidthRequest, table->MinColumnWidth * 4.0f); // FIXME-TABLE: Another constant/scale?
            sum_width_requests += column->WidthRequest;
        }
        else
        {
            // Initialize stretch weight
            if (column->AutoFitQueue != 0x00 || column->StretchWeight < 0.0f || !column_is_resizable)
            {
                if (column->InitStretchWeightOrWidth > 0.0f)
                    column->StretchWeight = column->InitStretchWeightOrWidth;
                else if (table_sizing_policy == ImGuiTableFlags_SizingStretchProp)
                    column->StretchWeight = (column->WidthAuto / stretch_sum_width_auto) * count_stretch;
                else
                    column->StretchWeight = 1.0f;
            }

            stretch_sum_weights += column->StretchWeight;
            if (table->LeftMostStretchedColumn == -1 || table->Columns[table->LeftMostStretchedColumn].DisplayOrder > column->DisplayOrder)
                table->LeftMostStretchedColumn = (ImGuiTableColumnIdx)column_n;
            if (table->RightMostStretchedColumn == -1 || table->Columns[table->RightMostStretchedColumn].DisplayOrder < column->DisplayOrder)
                table->RightMostStretchedColumn = (ImGuiTableColumnIdx)column_n;
        }
        column->IsPreserveWidthAuto = false;
        sum_width_requests += table->CellPaddingX * 2.0f;
    }
    table->ColumnsEnabledFixedCount = (ImGuiTableColumnIdx)count_fixed;

    // [Part 4] Apply final widths based on requested widths
    const ImRect work_rect = table->WorkRect;
    const float width_spacings = (table->OuterPaddingX * 2.0f) + (table->CellSpacingX1 + table->CellSpacingX2) * (table->ColumnsEnabledCount - 1);
    const float width_avail = ((table->Flags & ImGuiTableFlags_ScrollX) && table->InnerWidth == 0.0f) ? table->InnerClipRect.GetWidth() : work_rect.GetWidth();
    const float width_avail_for_stretched_columns = width_avail - width_spacings - sum_width_requests;
    float width_remaining_for_stretched_columns = width_avail_for_stretched_columns;
    table->ColumnsGivenWidth = width_spacings + (table->CellPaddingX * 2.0f) * table->ColumnsEnabledCount;
    for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
    {
        if (!(table->EnabledMaskByIndex & ((ImU64)1 << column_n)))
            continue;
        ImGuiTableColumn* column = &table->Columns[column_n];

        // Allocate width for stretched/weighted columns (StretchWeight gets converted into WidthRequest)
        if (column->Flags & ImGuiTableColumnFlags_WidthStretch)
        {
            float weight_ratio = column->StretchWeight / stretch_sum_weights;
            column->WidthRequest = IM_FLOOR(ImMax(width_avail_for_stretched_columns * weight_ratio, table->MinColumnWidth) + 0.01f);
            width_remaining_for_stretched_columns -= column->WidthRequest;
        }

        // [Resize Rule 1] The right-most Visible column is not resizable if there is at least one Stretch column
        // See additional comments in TableSetColumnWidth().
        if (column->NextEnabledColumn == -1 && table->LeftMostStretchedColumn != -1)
            column->Flags |= ImGuiTableColumnFlags_NoDirectResize_;

        // Assign final width, record width in case we will need to shrink
        column->WidthGiven = ImFloor(ImMax(column->WidthRequest, table->MinColumnWidth));
        table->ColumnsGivenWidth += column->WidthGiven;
    }

    // [Part 5] Redistribute stretch remainder width due to rounding (remainder width is < 1.0f * number of Stretch column).
    // Using right-to-left distribution (more likely to match resizing cursor).
    if (width_remaining_for_stretched_columns >= 1.0f && !(table->Flags & ImGuiTableFlags_PreciseWidths))
        for (int order_n = table->ColumnsCount - 1; stretch_sum_weights > 0.0f && width_remaining_for_stretched_columns >= 1.0f && order_n >= 0; order_n--)
        {
            if (!(table->EnabledMaskByDisplayOrder & ((ImU64)1 << order_n)))
                continue;
            ImGuiTableColumn* column = &table->Columns[table->DisplayOrderToIndex[order_n]];
            if (!(column->Flags & ImGuiTableColumnFlags_WidthStretch))
                continue;
            column->WidthRequest += 1.0f;
            column->WidthGiven += 1.0f;
            width_remaining_for_stretched_columns -= 1.0f;
        }

    table->HoveredColumnBody = -1;
    table->HoveredColumnBorder = -1;
    const ImRect mouse_hit_rect(table->OuterRect.Min.x, table->OuterRect.Min.y, table->OuterRect.Max.x, ImMax(table->OuterRect.Max.y, table->OuterRect.Min.y + table->LastOuterHeight));
    const bool is_hovering_table = ItemHoverable(mouse_hit_rect, 0);

    // [Part 6] Setup final position, offset, skip/clip states and clipping rectangles, detect hovered column
    // Process columns in their visible orders as we are comparing the visible order and adjusting host_clip_rect while looping.
    int visible_n = 0;
    bool offset_x_frozen = (table->FreezeColumnsCount > 0);
    float offset_x = ((table->FreezeColumnsCount > 0) ? table->OuterRect.Min.x : work_rect.Min.x) + table->OuterPaddingX - table->CellSpacingX1;
    ImRect host_clip_rect = table->InnerClipRect;
    //host_clip_rect.Max.x += table->CellPaddingX + table->CellSpacingX2;
    table->VisibleMaskByIndex = 0x00;
    table->RequestOutputMaskByIndex = 0x00;
    for (int order_n = 0; order_n < table->ColumnsCount; order_n++)
    {
        const int column_n = table->DisplayOrderToIndex[order_n];
        ImGuiTableColumn* column = &table->Columns[column_n];

        column->NavLayerCurrent = (ImS8)((table->FreezeRowsCount > 0 || column_n < table->FreezeColumnsCount) ? ImGuiNavLayer_Menu : ImGuiNavLayer_Main);

        if (offset_x_frozen && table->FreezeColumnsCount == visible_n)
        {
            offset_x += work_rect.Min.x - table->OuterRect.Min.x;
            offset_x_frozen = false;
        }

        // Clear status flags
        column->Flags &= ~ImGuiTableColumnFlags_StatusMask_;

        if ((table->EnabledMaskByDisplayOrder & ((ImU64)1 << order_n)) == 0)
        {
            // Hidden column: clear a few fields and we are done with it for the remainder of the function.
            // We set a zero-width clip rect but set Min.y/Max.y properly to not interfere with the clipper.
            column->MinX = column->MaxX = column->WorkMinX = column->ClipRect.Min.x = column->ClipRect.Max.x = offset_x;
            column->WidthGiven = 0.0f;
            column->ClipRect.Min.y = work_rect.Min.y;
            column->ClipRect.Max.y = FLT_MAX;
            column->ClipRect.ClipWithFull(host_clip_rect);
            column->IsVisibleX = column->IsVisibleY = column->IsRequestOutput = false;
            column->IsSkipItems = true;
            column->ItemWidth = 1.0f;
            continue;
        }

        // Detect hovered column
        if (is_hovering_table && g.IO.MousePos.x >= column->ClipRect.Min.x && g.IO.MousePos.x < column->ClipRect.Max.x)
            table->HoveredColumnBody = (ImGuiTableColumnIdx)column_n;

        // Lock start position
        column->MinX = offset_x;

        // Lock width based on start position and minimum/maximum width for this position
        float max_width = TableGetMaxColumnWidth(table, column_n);
        column->WidthGiven = ImMin(column->WidthGiven, max_width);
        column->WidthGiven = ImMax(column->WidthGiven, ImMin(column->WidthRequest, table->MinColumnWidth));
        column->MaxX = offset_x + column->WidthGiven + table->CellSpacingX1 + table->CellSpacingX2 + table->CellPaddingX * 2.0f;

        // Lock other positions
        // - ClipRect.Min.x: Because merging draw commands doesn't compare min boundaries, we make ClipRect.Min.x match left bounds to be consistent regardless of merging.
        // - ClipRect.Max.x: using WorkMaxX instead of MaxX (aka including padding) makes things more consistent when resizing down, tho slightly detrimental to visibility in very-small column.
        // - ClipRect.Max.x: using MaxX makes it easier for header to receive hover highlight with no discontinuity and display sorting arrow.
        // - FIXME-TABLE: We want equal width columns to have equal (ClipRect.Max.x - WorkMinX) width, which means ClipRect.max.x cannot stray off host_clip_rect.Max.x else right-most column may appear shorter.
        column->WorkMinX = column->MinX + table->CellPaddingX + table->CellSpacingX1;
        column->WorkMaxX = column->MaxX - table->CellPaddingX - table->CellSpacingX2; // Expected max
        column->ItemWidth = ImFloor(column->WidthGiven * 0.65f);
        column->ClipRect.Min.x = column->MinX;
        column->ClipRect.Min.y = work_rect.Min.y;
        column->ClipRect.Max.x = column->MaxX; //column->WorkMaxX;
        column->ClipRect.Max.y = FLT_MAX;
        column->ClipRect.ClipWithFull(host_clip_rect);

        // Mark column as Clipped (not in sight)
        // Note that scrolling tables (where inner_window != outer_window) handle Y clipped earlier in BeginTable() so IsVisibleY really only applies to non-scrolling tables.
        // FIXME-TABLE: Because InnerClipRect.Max.y is conservatively ==outer_window->ClipRect.Max.y, we never can mark columns _Above_ the scroll line as not IsVisibleY.
        // Taking advantage of LastOuterHeight would yield good results there...
        // FIXME-TABLE: Y clipping is disabled because it effectively means not submitting will reduce contents width which is fed to outer_window->DC.CursorMaxPos.x,
        // and this may be used (e.g. typically by outer_window using AlwaysAutoResize or outer_window's horizontal scrollbar, but could be something else).
        // Possible solution to preserve last known content width for clipped column. Test 'table_reported_size' fails when enabling Y clipping and window is resized small.
        column->IsVisibleX = (column->ClipRect.Max.x > column->ClipRect.Min.x);
        column->IsVisibleY = true; // (column->ClipRect.Max.y > column->ClipRect.Min.y);
        const bool is_visible = column->IsVisibleX; //&& column->IsVisibleY;
        if (is_visible)
            table->VisibleMaskByIndex |= ((ImU64)1 << column_n);

        // Mark column as requesting output from user. Note that fixed + non-resizable sets are auto-fitting at all times and therefore always request output.
        column->IsRequestOutput = is_visible || column->AutoFitQueue != 0 || column->CannotSkipItemsQueue != 0;
        if (column->IsRequestOutput)
            table->RequestOutputMaskByIndex |= ((ImU64)1 << column_n);

        // Mark column as SkipItems (ignoring all items/layout)
        column->IsSkipItems = !column->IsEnabled || table->HostSkipItems;
        if (column->IsSkipItems)
            IM_ASSERT(!is_visible);

        // Update status flags
        column->Flags |= ImGuiTableColumnFlags_IsEnabled;
        if (is_visible)
            column->Flags |= ImGuiTableColumnFlags_IsVisible;
        if (column->SortOrder != -1)
            column->Flags |= ImGuiTableColumnFlags_IsSorted;
        if (table->HoveredColumnBody == column_n)
            column->Flags |= ImGuiTableColumnFlags_IsHovered;

        // Alignment
        // FIXME-TABLE: This align based on the whole column width, not per-cell, and therefore isn't useful in
        // many cases (to be able to honor this we might be able to store a log of cells width, per row, for
        // visible rows, but nav/programmatic scroll would have visible artifacts.)
        //if (column->Flags & ImGuiTableColumnFlags_AlignRight)
        //    column->WorkMinX = ImMax(column->WorkMinX, column->MaxX - column->ContentWidthRowsUnfrozen);
        //else if (column->Flags & ImGuiTableColumnFlags_AlignCenter)
        //    column->WorkMinX = ImLerp(column->WorkMinX, ImMax(column->StartX, column->MaxX - column->ContentWidthRowsUnfrozen), 0.5f);

        // Reset content width variables
        column->ContentMaxXFrozen = column->ContentMaxXUnfrozen = column->WorkMinX;
        column->ContentMaxXHeadersUsed = column->ContentMaxXHeadersIdeal = column->WorkMinX;

        // Don't decrement auto-fit counters until container window got a chance to submit its items
        if (table->HostSkipItems == false)
        {
            column->AutoFitQueue >>= 1;
            column->CannotSkipItemsQueue >>= 1;
        }

        if (visible_n < table->FreezeColumnsCount)
            host_clip_rect.Min.x = ImClamp(column->MaxX + TABLE_BORDER_SIZE, host_clip_rect.Min.x, host_clip_rect.Max.x);

        offset_x += column->WidthGiven + table->CellSpacingX1 + table->CellSpacingX2 + table->CellPaddingX * 2.0f;
        visible_n++;
    }

    // [Part 7] Detect/store when we are hovering the unused space after the right-most column (so e.g. context menus can react on it)
    // Clear Resizable flag if none of our column are actually resizable (either via an explicit _NoResize flag, either
    // because of using _WidthAuto/_WidthStretch). This will hide the resizing option from the context menu.
    const float unused_x1 = ImMax(table->WorkRect.Min.x, table->Columns[table->RightMostEnabledColumn].ClipRect.Max.x);
    if (is_hovering_table && table->HoveredColumnBody == -1)
    {
        if (g.IO.MousePos.x >= unused_x1)
            table->HoveredColumnBody = (ImGuiTableColumnIdx)table->ColumnsCount;
    }
    if (has_resizable == false && (table->Flags & ImGuiTableFlags_Resizable))
        table->Flags &= ~ImGuiTableFlags_Resizable;

    // [Part 8] Lock actual OuterRect/WorkRect right-most position.
    // This is done late to handle the case of fixed-columns tables not claiming more widths that they need.
    // Because of this we are careful with uses of WorkRect and InnerClipRect before this point.
    if (table->RightMostStretchedColumn != -1)
        table->Flags &= ~ImGuiTableFlags_NoHostExtendX;
    if (table->Flags & ImGuiTableFlags_NoHostExtendX)
    {
        table->OuterRect.Max.x = table->WorkRect.Max.x = unused_x1;
        table->InnerClipRect.Max.x = ImMin(table->InnerClipRect.Max.x, unused_x1);
    }
    table->InnerWindow->ParentWorkRect = table->WorkRect;
    table->BorderX1 = table->InnerClipRect.Min.x;// +((table->Flags & ImGuiTableFlags_BordersOuter) ? 0.0f : -1.0f);
    table->BorderX2 = table->InnerClipRect.Max.x;// +((table->Flags & ImGuiTableFlags_BordersOuter) ? 0.0f : +1.0f);

    // [Part 9] Allocate draw channels and setup background cliprect
    TableSetupDrawChannels(table);

    // [Part 10] Hit testing on borders
    if (table->Flags & ImGuiTableFlags_Resizable)
        TableUpdateBorders(table);
    table->LastFirstRowHeight = 0.0f;
    table->IsLayoutLocked = true;
    table->IsUsingHeaders = false;

    // [Part 11] Context menu
    if (table->IsContextPopupOpen && table->InstanceCurrent == table->InstanceInteracted)
    {
        const ImGuiID context_menu_id = ImHashStr("##ContextMenu", 0, table->ID);
        if (BeginPopupEx(context_menu_id, ImGuiWindowFlags_AlwaysAutoResize | ImGuiWindowFlags_NoTitleBar | ImGuiWindowFlags_NoSavedSettings))
        {
            TableDrawContextMenu(table);
            EndPopup();
        }
        else
        {
            table->IsContextPopupOpen = false;
        }
    }

    // [Part 13] Sanitize and build sort specs before we have a change to use them for display.
    // This path will only be exercised when sort specs are modified before header rows (e.g. init or visibility change)
    if (table->IsSortSpecsDirty && (table->Flags & ImGuiTableFlags_Sortable))
        TableSortSpecsBuild(table);

    // Initial state
    ImGuiWindow* inner_window = table->InnerWindow;
    if (table->Flags & ImGuiTableFlags_NoClip)
        table->DrawSplitter.SetCurrentChannel(inner_window->DrawList, TABLE_DRAW_CHANNEL_NOCLIP);
    else
        inner_window->DrawList->PushClipRect(inner_window->ClipRect.Min, inner_window->ClipRect.Max, false);
}